

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_files.h
# Opt level: O0

char * cf_get_ext(cf_file_t *file)

{
  char *pcVar1;
  char *local_20;
  char *period;
  char *name;
  cf_file_t *file_local;
  
  local_20 = (char *)0x0;
  period = file->name;
  while (pcVar1 = period + 1, *period != '\0') {
    period = pcVar1;
    if (*pcVar1 == '.') {
      local_20 = pcVar1;
    }
  }
  if (local_20 == (char *)0x0) {
    file->ext[0] = '\0';
  }
  else {
    cf_safe_strcpy_internal
              (file->ext,local_20,0,0x20,
               "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/cute/cute_files.h"
               ,0xe7);
  }
  return file->ext;
}

Assistant:

const char* cf_get_ext(cf_file_t* file)
{
	char* name = file->name;
	char* period = NULL;
	while (*name++) if (*name == '.') period = name;
	if (period) cf_safe_strcpy(file->ext, period, 0, CUTE_FILES_MAX_EXT);
	else file->ext[0] = 0;
	return file->ext;
}